

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrhiwidget.cpp
# Opt level: O0

void __thiscall QRhiWidgetPrivate::ensureRhi(QRhiWidgetPrivate *this)

{
  int iVar1;
  Api AVar2;
  int iVar3;
  function<void_(QRhi_*)> *this_00;
  anon_class_16_2_d7082a84 *__f;
  undefined8 uVar4;
  QRhi *pQVar5;
  QRhiWidgetPrivate *in_RDI;
  long in_FS_OFFSET;
  QRhi *currentRhi;
  QRhiWidget *q;
  char *in_stack_ffffffffffffff68;
  anon_class_16_2_d7082a84 *paVar6;
  QRhiWidgetPrivate *in_stack_ffffffffffffff70;
  char *in_stack_ffffffffffffff78;
  QRhi *pQVar7;
  undefined4 in_stack_ffffffffffffff80;
  char local_28 [32];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (function<void_(QRhi_*)> *)q_func(in_RDI);
  __f = (anon_class_16_2_d7082a84 *)QWidgetPrivate::rhi(&in_RDI->super_QWidgetPrivate);
  if (__f != (anon_class_16_2_d7082a84 *)0x0) {
    iVar1 = QRhi::backend();
    AVar2 = QPlatformBackingStoreRhiConfig::api(&in_RDI->config);
    iVar3 = QBackingStoreRhiSupport::apiToRhiBackend(AVar2);
    if (iVar1 != iVar3) {
      QMessageLogger::QMessageLogger
                ((QMessageLogger *)CONCAT44(iVar1,in_stack_ffffffffffffff80),
                 in_stack_ffffffffffffff78,(int)((ulong)in_stack_ffffffffffffff70 >> 0x20),
                 in_stack_ffffffffffffff68);
      uVar4 = QRhi::backendName();
      QMessageLogger::warning
                (local_28,
                 "The top-level window is already using another graphics API for composition, \'%s\' is not compatible with this widget"
                 ,uVar4);
      goto LAB_003480b5;
    }
  }
  if ((__f != (anon_class_16_2_d7082a84 *)0x0) && ((anon_class_16_2_d7082a84 *)in_RDI->rhi != __f))
  {
    if (in_RDI->rhi != (QRhi *)0x0) {
      pQVar7 = in_RDI->rhi;
      pQVar5 = QBackingStoreRhiSupport::rhi(&in_RDI->offscreenRenderer);
      if (pQVar7 == pQVar5) {
        (**(code **)(*(long *)&(this_00->super__Function_base)._M_functor + 0x1b0))();
        releaseResources(in_stack_ffffffffffffff70);
        QBackingStoreRhiSupport::reset();
      }
      else {
        resetRenderTargetObjects(in_stack_ffffffffffffff70);
        resetColorBufferObjects(in_stack_ffffffffffffff70);
      }
    }
    paVar6 = __f;
    std::function<void(QRhi*)>::function<QRhiWidgetPrivate::ensureRhi()::__0,void>(this_00,__f);
    QRhi::addCleanupCallback(paVar6,(function *)this_00);
    std::function<void_(QRhi_*)>::~function((function<void_(QRhi_*)> *)0x3480a4);
  }
  in_RDI->rhi = (QRhi *)__f;
LAB_003480b5:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QRhiWidgetPrivate::ensureRhi()
{
    Q_Q(QRhiWidget);
    QRhi *currentRhi = QWidgetPrivate::rhi();
    if (currentRhi && currentRhi->backend() != QBackingStoreRhiSupport::apiToRhiBackend(config.api())) {
        qWarning("The top-level window is already using another graphics API for composition, "
                 "'%s' is not compatible with this widget",
                 currentRhi->backendName());
        return;
    }

    // NB the rhi member may be an invalid object, the pointer can be used, but no deref
    if (currentRhi && rhi != currentRhi) {
        if (rhi) {
            // if previously we created our own but now get a QRhi from the
            // top-level, then drop what we have and start using the top-level's
            if (rhi == offscreenRenderer.rhi()) {
                q->releaseResources(); // notify the user code about the early-release
                releaseResources();
                offscreenRenderer.reset();
            } else {
                // rhi resources created by us all belong to the old rhi, drop them;
                // due to nulling out colorTexture this is also what ensures that
                // initialize() is going to be called again eventually
                resetRenderTargetObjects();
                resetColorBufferObjects();
            }
        }

        // Normally the widget gets destroyed before the QRhi (which is managed by
        // the top-level's backingstore). When reparenting between top-levels is
        // involved, that is not always the case. Therefore we use a per-widget rhi
        // cleanup callback to get notified when the QRhi is about to be destroyed
        // while the QRhiWidget is still around.
        currentRhi->addCleanupCallback(q, [q, this](QRhi *regRhi) {
            if (!QWidgetPrivate::get(q)->data.in_destructor && this->rhi == regRhi) {
                q->releaseResources(); // notify the user code about the early-release
                releaseResources();
                // must null out our ref, the QRhi object is going to be invalid
                this->rhi = nullptr;
            }
        });
    }

    rhi = currentRhi;
}